

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * __thiscall rw::Image::extractMask(Image *this)

{
  uint8 uVar1;
  int32 i;
  Image *this_00;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte bVar9;
  int32 iVar10;
  
  this_00 = create(this->width,this->height,8);
  allocate(this_00);
  lVar2 = 0;
  do {
    uVar1 = (uint8)lVar2;
    this_00->palette[lVar2 * 4] = uVar1;
    this_00->palette[lVar2 * 4 + 1] = uVar1;
    this_00->palette[lVar2 * 4 + 2] = uVar1;
    this_00->palette[lVar2 * 4 + 3] = 0xff;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  iVar6 = this->height;
  if (0 < iVar6) {
    pbVar3 = this_00->pixels;
    pbVar4 = this->pixels;
    iVar10 = this->width;
    iVar5 = 0;
    do {
      if (0 < iVar10) {
        iVar6 = 0;
        pbVar7 = pbVar3;
        pbVar8 = pbVar4;
        do {
          switch(this->depth << 0x1e | this->depth - 4U >> 2) {
          case 0:
          case 1:
            bVar9 = this->palette[(ulong)*pbVar8 * 4 + 3];
            lVar2 = 1;
            break;
          default:
            goto switchD_0010ef95_caseD_2;
          case 3:
            bVar9 = (char)pbVar8[1] >> 7;
            lVar2 = 2;
            break;
          case 5:
            lVar2 = 3;
            bVar9 = 0xff;
            break;
          case 7:
            bVar9 = pbVar8[3];
            lVar2 = 4;
          }
          *pbVar7 = bVar9;
          pbVar7 = pbVar7 + 1;
          pbVar8 = pbVar8 + lVar2;
switchD_0010ef95_caseD_2:
          iVar6 = iVar6 + 1;
          iVar10 = this->width;
        } while (iVar6 < iVar10);
        iVar6 = this->height;
      }
      pbVar4 = pbVar4 + this->stride;
      pbVar3 = pbVar3 + this_00->stride;
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar6);
  }
  return this_00;
}

Assistant:

Image*
Image::extractMask(void)
{
	Image *img = Image::create(this->width, this->height, 8);
	img->allocate();

	// use an 8bit palette to store all shades of grey
	for(int32 i = 0; i < 256; i++){
		img->palette[i*4+0] = i;
		img->palette[i*4+1] = i;
		img->palette[i*4+2] = i;
		img->palette[i*4+3] = 0xFF;
	}

	// Then use the alpha value as palette index
	uint8 *line = this->pixels;
	uint8 *nline = img->pixels;
	uint8 *p, *np;
	for(int32 y = 0; y < this->height; y++){
		p = line;
		np = nline;
		for(int32 x = 0; x < this->width; x++){
			switch(this->depth){
			case 4:
			case 8:
				*np++ = this->palette[*p*4+3];
				p++;
				break;
			case 16:
				*np++ = 0xFF*!!(p[1]&0x80);
				p += 2;
				break;
			case 24:
				*np++ = 0xFF;
				p += 3;
				break;
			case 32:
				*np++ = p[3];
				p += 4;
				break;
			}
		}
		line += this->stride;
		nline += img->stride;
	}
	return img;
}